

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

uint32_t map_get_uint32(map *map,void *key,natwm_error *error)

{
  uint in_EAX;
  natwm_error nVar1;
  map_entry *pmVar2;
  undefined8 uStack_28;
  uint32_t index;
  
  uStack_28 = (ulong)in_EAX;
  nVar1 = map_search(map,key,(uint32_t *)((long)&uStack_28 + 4));
  if (nVar1 == NO_ERROR) {
    pmVar2 = map->entries[uStack_28 >> 0x20];
  }
  else {
    pmVar2 = (map_entry *)0x0;
  }
  if (pmVar2 == (map_entry *)0x0) {
    *error = NOT_FOUND_ERROR;
  }
  *error = NO_ERROR;
  return *pmVar2->value;
}

Assistant:

uint32_t map_get_uint32(const struct map *map, const void *key, enum natwm_error *error)
{
        struct map_entry *entry = map_get(map, key);

        if (entry == NULL) {
                *error = NOT_FOUND_ERROR;
        }

        *error = NO_ERROR;

        return *(uint32_t *)entry->value;
}